

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

bool __thiscall ON_Displacement::operator==(ON_Displacement *this,ON_Displacement *dsp)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  SweepResolutionFormulas SVar5;
  SweepResolutionFormulas SVar6;
  double dVar7;
  double dVar8;
  ON_UUID local_40;
  ON_UUID local_30;
  
  bVar1 = On(this);
  bVar2 = On(dsp);
  if (bVar1 == bVar2) {
    local_30 = Texture(this);
    local_40 = Texture(dsp);
    bVar1 = ::operator!=(&local_30,&local_40);
    if (!bVar1) {
      iVar3 = MappingChannel(this);
      iVar4 = MappingChannel(dsp);
      if (iVar3 == iVar4) {
        dVar7 = BlackPoint(this);
        dVar8 = BlackPoint(dsp);
        if ((dVar7 == dVar8) && (!NAN(dVar7) && !NAN(dVar8))) {
          dVar7 = WhitePoint(this);
          dVar8 = WhitePoint(dsp);
          if ((dVar7 == dVar8) && (!NAN(dVar7) && !NAN(dVar8))) {
            iVar3 = InitialQuality(this);
            iVar4 = InitialQuality(dsp);
            if (iVar3 == iVar4) {
              bVar1 = FinalMaxFacesOn(this);
              bVar2 = FinalMaxFacesOn(dsp);
              if (bVar1 == bVar2) {
                iVar3 = FinalMaxFaces(this);
                iVar4 = FinalMaxFaces(dsp);
                if (iVar3 == iVar4) {
                  bVar1 = FairingOn(this);
                  bVar2 = FairingOn(dsp);
                  if (bVar1 == bVar2) {
                    iVar3 = Fairing(this);
                    iVar4 = Fairing(dsp);
                    if (iVar3 == iVar4) {
                      dVar7 = PostWeldAngle(this);
                      dVar8 = PostWeldAngle(dsp);
                      if ((dVar7 == dVar8) && (!NAN(dVar7) && !NAN(dVar8))) {
                        iVar3 = MeshMemoryLimit(this);
                        iVar4 = MeshMemoryLimit(dsp);
                        if (iVar3 == iVar4) {
                          iVar3 = RefineSteps(this);
                          iVar4 = RefineSteps(dsp);
                          if (iVar3 == iVar4) {
                            dVar7 = RefineSensitivity(this);
                            dVar8 = RefineSensitivity(dsp);
                            if ((dVar7 == dVar8) && (!NAN(dVar7) && !NAN(dVar8))) {
                              SVar5 = SweepResolutionFormula(this);
                              SVar6 = SweepResolutionFormula(dsp);
                              return SVar5 == SVar6;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Displacement::operator == (const ON_Displacement& dsp) const
{
  if (On()                     != dsp.On())                     return false;
  if (Texture()                != dsp.Texture())                return false;
  if (MappingChannel()         != dsp.MappingChannel())         return false;
  if (BlackPoint()             != dsp.BlackPoint())             return false;
  if (WhitePoint()             != dsp.WhitePoint())             return false;
  if (InitialQuality()         != dsp.InitialQuality())         return false;
  if (FinalMaxFacesOn()        != dsp.FinalMaxFacesOn())        return false;
  if (FinalMaxFaces()          != dsp.FinalMaxFaces())          return false;
  if (FairingOn()              != dsp.FairingOn())              return false;
  if (Fairing()                != dsp.Fairing())                return false;
  if (PostWeldAngle()          != dsp.PostWeldAngle())          return false;
  if (MeshMemoryLimit()        != dsp.MeshMemoryLimit())        return false;
  if (RefineSteps()            != dsp.RefineSteps())            return false;
  if (RefineSensitivity()      != dsp.RefineSensitivity())      return false;
  if (SweepResolutionFormula() != dsp.SweepResolutionFormula()) return false;

  return true;
}